

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_common.h
# Opt level: O3

void __thiscall
ktx::OptionsEncodeCommon::process
          (OptionsEncodeCommon *this,Options *param_1,ParseResult *args,Reporter *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  uint uVar3;
  OptionValue *pOVar4;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,kNormalMode,&local_41);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_40);
  sVar2 = pOVar4->m_count;
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 != 0) {
    captureCommonOption(this,kNormalMode);
    this->normalMap = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,kThreads,&local_41);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_40);
  sVar2 = pOVar4->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 != 0) {
    uVar3 = captureCodecOption<unsigned_int>(this,args,kThreads);
    this->threadCount = uVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,kNoSse,&local_41);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_40);
  sVar2 = pOVar4->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 != 0) {
    captureCommonOption(this,kNoSse);
    this->noSSE = true;
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter&) {
        if (args[kNormalMode].count()) {
            captureCommonOption(kNormalMode);
            normalMap = true;
        }

        if (args[kThreads].count()) {
            threadCount = captureCodecOption<uint32_t>(args, kThreads);
        }

        if (args[kNoSse].count()) {
            captureCommonOption(kNoSse);
            noSSE = true;
        }
    }